

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavUtility.cpp
# Opt level: O1

string * __thiscall
WavParserHelper::GetTestFilePath_abi_cxx11_
          (string *__return_storage_ptr__,WavParserHelper *this,TestFileType FileType)

{
  char *pcVar1;
  string FileName;
  string BasePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"../../Resource/","");
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((uint)this < 0x16) {
    pcVar1 = &DAT_0010bb6c + *(int *)(&DAT_0010bb6c + ((ulong)this & 0xffffffff) * 4);
  }
  else {
    pcVar1 = "Invalid";
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)pcVar1);
  std::operator+(&local_50,&local_70,&local_90);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WavParserHelper::GetTestFilePath(TestFileType FileType)
{
	std::string BasePath = "../../Resource/";
	std::string FileName;
	std::string FilePath;
	switch (FileType)
	{
	case TestFileType::Uint8Stereo:
		FileName = "M1F1-uint8-AFsp.wav";
		break;
	case TestFileType::Uint8ALawStereo:
		FileName = "M1F1-Alaw-AFsp.wav";
		break;
	case TestFileType::UInt8MuLawStereo:
		FileName = "M1F1-mulaw-AFsp.wav";
		break;
	case TestFileType::Int12Stereo:
		FileName = "M1F1-int12-AFsp.wav";
		break;
	case TestFileType::Int16Stereo:
		FileName = "M1F1-int16-AFsp.wav";
		break;
	case TestFileType::Int24Stereo:
		FileName = "M1F1-int24-AFsp.wav";
		break;
	case TestFileType::Int32Stereo:
		FileName = "M1F1-int32-AFsp.wav";
		break;
	case TestFileType::Float32Stereo:
		FileName = "M1F1-float32-AFsp.wav";
		break;
	case TestFileType::Float64Stereo:
		FileName = "M1F1-float64-AFsp.wav";
		break;
	case TestFileType::Uint8StereoExt:
		FileName = "M1F1-uint8WE-AFsp.wav";
		break;
	case TestFileType::UInt8ALawStereoExt:
		FileName = "M1F1-AlawWE-AFsp.wav";
		break;
	case TestFileType::UInt8MuLawStereoExt:
		FileName = "M1F1-mulawWE-AFsp.wav";
		break;
	case TestFileType::Int12StereoExt:
		FileName = "M1F1-int12WE-AFsp.wav";
		break;
	case TestFileType::Int16StereoExt:
		FileName = "M1F1-int16WE-AFsp.wav";
		break;
	case TestFileType::Int24StereoExt:
		FileName = "M1F1-int24WE-AFsp.wav";
		break;
	case TestFileType::Int32StereoExt:
		FileName = "M1F1-int32WE-AFsp.wav";
		break;
	case TestFileType::Float32StereoExt:
		FileName = "M1F1-float32WE-AFsp.wav";
		break;
	case TestFileType::Float64StereoExt:
		FileName = "M1F1-float64WE-AFsp.wav";
		break;
	case TestFileType::Int16Channel_6:
		FileName = "6_Channel_ID.wav";
		break;
	case TestFileType::Int24Channel_8:
		FileName = "8_Channel_ID.wav";
		break;
	case TestFileType::Int16Bwf:
		FileName = "M1F1-Bwf-16bit.wav";
		break;
	case TestFileType::Int24RF64:
		FileName = "M1F1-Bwf-RF64-24bit.wav";
		break;
	default:
		FileName = "Invalid";
	}

	FilePath = BasePath + FileName;

	return FilePath;
}